

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCreateExtkeyFromSeed(void *handle,char *seed_hex,int network_type,int key_type,char **extkey)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  allocator local_82;
  HDWalletApi api;
  string key;
  string local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  if (extkey == (char **)0x0) {
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length._0_4_ = 0x680;
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a156d;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"extkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. extkey is null.",(allocator *)&local_60);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(seed_hex);
  if (!bVar1) {
    is_bitcoin = true;
    net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      std::__cxx11::string::string((string *)&local_60,seed_hex,&local_82);
      cfd::core::ByteData::ByteData((ByteData *)&local_40,&local_60);
      cfd::api::HDWalletApi::CreateExtkeyFromSeed_abi_cxx11_
                (&key,&api,(ByteData *)&local_40,net_type,key_type);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      pcVar2 = cfd::capi::CreateString(&key);
      *extkey = pcVar2;
      std::__cxx11::string::~string((string *)&key);
      return 0;
    }
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length._0_4_ = 0x68f;
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a156d;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. privkey\'s network_type is invalid.",
               (allocator *)&local_60);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key._M_dataplus._M_p = "cfdcapi_key.cpp";
  key._M_string_length._0_4_ = 0x686;
  key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a156d;
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"seed is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. seed is null or empty.",(allocator *)&local_60);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateExtkeyFromSeed(
    void* handle, const char* seed_hex, int network_type, int key_type,
    char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(seed_hex)) {
      warn(CFD_LOG_SOURCE, "seed is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. seed is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    ExtKeyType output_key_type = static_cast<ExtKeyType>(key_type);
    HDWalletApi api;
    std::string key = api.CreateExtkeyFromSeed(
        ByteData(seed_hex), net_type, output_key_type);
    *extkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}